

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

vec3f * __thiscall Model::normal(vec3f *__return_storage_ptr__,Model *this,vec2f *uvf)

{
  TGAImage *this_00;
  uint8_t auVar1 [4];
  TGAColor TVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  TGAColor *pTVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  TGAColor c;
  
  this_00 = &this->normalmap_;
  dVar10 = uvf->x;
  sVar3 = TGAImage::get_width(this_00);
  auVar8._8_4_ = (int)(sVar3 >> 0x20);
  auVar8._0_8_ = sVar3;
  auVar8._12_4_ = 0x45300000;
  dVar10 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * dVar10;
  uVar4 = (ulong)dVar10;
  dVar11 = uvf->y;
  sVar3 = TGAImage::get_height(this_00);
  auVar9._8_4_ = (int)(sVar3 >> 0x20);
  auVar9._0_8_ = sVar3;
  auVar9._12_4_ = 0x45300000;
  dVar11 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * dVar11;
  uVar5 = (ulong)dVar11;
  TVar2 = TGAImage::get(this_00,(long)(dVar10 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4
                        ,(long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
  pTVar7 = &c;
  auVar1 = TVar2.bgra;
  c.bgra[0] = auVar1[0];
  c.bgra[1] = auVar1[1];
  c.bgra[2] = auVar1[2];
  c.bgra[3] = auVar1[3];
  c.bytespp = TVar2.bytespp;
  __return_storage_ptr__->z = 0.0;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  for (sVar3 = 2; sVar3 != 0xffffffffffffffff; sVar3 = sVar3 - 1) {
    dVar10 = (double)pTVar7->bgra[0] / 255.0;
    pdVar6 = vec<3UL,_double>::operator[](__return_storage_ptr__,sVar3);
    *pdVar6 = dVar10 + dVar10 + -1.0;
    pTVar7 = (TGAColor *)(pTVar7->bgra + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

vec3f Model::normal(const vec2f &uvf) const
{
    TGAColor c = normalmap_.get(static_cast<size_t>(uvf[0] * normalmap_.get_width()),
                                static_cast<size_t>(uvf[1] * normalmap_.get_height()));
    vec3f res;
    for (size_t i = 0; i < 3; i++) res[2 - i] = c[i] / 255. * 2 - 1;
    return res;
}